

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.cpp
# Opt level: O2

vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_> *
spvtools::opt::anon_unknown_15::GetAllTopLevelConstants
          (vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
           *__return_storage_ptr__,SENode *node)

{
  undefined8 *puVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  undefined8 *puVar4;
  SEConstantNode *recurrent_node;
  _Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  local_38;
  undefined4 extraout_var_00;
  
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (*node->_vptr_SENode[4])(node);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar2);
  if (local_38._M_impl.super__Vector_impl_data._M_start != (SEConstantNode **)0x0) {
    std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>::
    push_back(__return_storage_ptr__,(value_type *)&local_38);
  }
  iVar2 = (*node->_vptr_SENode[8])(node);
  lVar3 = CONCAT44(extraout_var_00,iVar2);
  if (lVar3 != 0) {
    puVar1 = *(undefined8 **)(lVar3 + 0x10);
    for (puVar4 = *(undefined8 **)(lVar3 + 8); puVar4 != puVar1; puVar4 = puVar4 + 1) {
      GetAllTopLevelConstants
                ((vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                  *)&local_38,(SENode *)*puVar4);
      std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>::
      insert<__gnu_cxx::__normal_iterator<spvtools::opt::SEConstantNode**,std::vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>>,void>
                ((vector<spvtools::opt::SEConstantNode*,std::allocator<spvtools::opt::SEConstantNode*>>
                  *)__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<spvtools::opt::SEConstantNode_**,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
                  )local_38._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<spvtools::opt::SEConstantNode_**,_std::vector<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>_>
                  )local_38._M_impl.super__Vector_impl_data._M_finish);
      std::
      _Vector_base<spvtools::opt::SEConstantNode_*,_std::allocator<spvtools::opt::SEConstantNode_*>_>
      ::~_Vector_base(&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<SEConstantNode*> GetAllTopLevelConstants(SENode* node) {
  auto nodes = std::vector<SEConstantNode*>{};
  if (auto recurrent_node = node->AsSEConstantNode()) {
    nodes.push_back(recurrent_node);
  }

  if (auto add_node = node->AsSEAddNode()) {
    for (auto child : add_node->GetChildren()) {
      auto child_nodes = GetAllTopLevelConstants(child);
      nodes.insert(nodes.end(), child_nodes.begin(), child_nodes.end());
    }
  }

  return nodes;
}